

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hxx
# Opt level: O3

void lineage::validate(ProblemGraph *problemGraph,Solution *solution)

{
  Graph *graph;
  Problem *pPVar1;
  unsigned_long uVar2;
  pointer pEVar3;
  Value VVar4;
  Value VVar5;
  size_t vs;
  size_t vt;
  bool bVar6;
  ostream *poVar7;
  pointer pRVar8;
  pointer puVar9;
  pointer pvVar10;
  long extraout_RDX;
  long lVar11;
  pointer pAVar12;
  size_t sVar13;
  ulong uVar14;
  ComponentLabeling componentsPerFrame;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> descendantComponents;
  ComponentLabeling components;
  SubgraphWithoutCut subgraphCut;
  SubgraphCutPerFrame subgraphCutPerFrame;
  SubgraphCutTwoFrames subgraph;
  ulong local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  ulong local_d0;
  undefined1 local_c8 [16];
  _Base_ptr local_b8;
  _Base_ptr p_Stack_b0;
  _Base_ptr local_a8;
  _Map_pointer ppuStack_a0;
  _Elt_pointer local_98;
  _Elt_pointer puStack_90;
  _Elt_pointer local_88;
  _Map_pointer ppuStack_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  SubgraphWithoutCut local_60;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  
  pPVar1 = problemGraph->problem_;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.edgeLabels_ = &solution->edge_labels;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_78,
             (long)(problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  graph = &problemGraph->graph_;
  andres::graph::
  labelComponents<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::validate(lineage::ProblemGraph_const&,lineage::Solution_const&)::SubgraphWithoutCut,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (graph,&local_60,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start);
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.problem_ = pPVar1;
  local_58.edgeLabels_ = &solution->edge_labels;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_e8,
             (long)(problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  andres::graph::
  labelComponents<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (graph,&local_58,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"overall: ",9);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," nodes, ",8);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," edges",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (problemGraph->numberOfFrames_ != 0) {
    local_118 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"frame ",6);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      lVar11 = local_118 * 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," nodes, ",8);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," edges",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_118 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"   ",3);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," inter-frame edges with frame ",0x1e);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      if (local_118 != problemGraph->numberOfFrames_ - 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"   ",3);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," inter-frame edges with frame ",0x1e);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      pvVar10 = (problemGraph->edgeIndicesInFrame_).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar9 = pvVar10[local_118].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar10[local_118].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data + 8) == puVar9) {
LAB_0011ba03:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"   the intra-frame edges labeled 1 well-define a multicut"
                   ,0x39);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
      }
      else {
        bVar6 = true;
        uVar14 = 0;
        do {
          uVar2 = puVar9[uVar14];
          pEVar3 = (problemGraph->graph_).edges_.
                   super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          VVar4 = pEVar3[uVar2].vertexIndices_[0];
          VVar5 = pEVar3[uVar2].vertexIndices_[1];
          if ((local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[VVar4] !=
              local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[VVar5]) ==
              ((solution->edge_labels).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2] == '\0')) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"   error: the intra-frame edge ",0x1f);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," between nodes ",0xf);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," (t=",4);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,
                                (problemGraph->problem_->nodes).
                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                _M_impl.super__Vector_impl_data._M_start[VVar4].t);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cx=",5);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + VVar4) +
                                        8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cy=",5);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + VVar4) +
                                        0xc));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", frame component=",0x12);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,") and ",6);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," (t=",4);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,
                                (problemGraph->problem_->nodes).
                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                _M_impl.super__Vector_impl_data._M_start[VVar5].t);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cx=",5);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + VVar5) +
                                        8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cy=",5);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + VVar5) +
                                        0xc));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", frame component=",0x12);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,") is part of a violated cycle constraint.",0x29);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            pvVar10 = (problemGraph->edgeIndicesInFrame_).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            bVar6 = false;
          }
          uVar14 = uVar14 + 1;
          puVar9 = pvVar10[local_118].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar14 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar10[local_118].
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)puVar9 >> 3));
        if (bVar6) goto LAB_0011ba03;
      }
      if ((local_118 < problemGraph->numberOfFrames_ - 1) &&
         (pvVar10 = (problemGraph->nodeIndicesInFrame_).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         puVar9 = pvVar10[local_118].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
         *(pointer *)
          ((long)&pvVar10[local_118].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data + 8) != puVar9)) {
        uVar14 = 0;
        do {
          uVar2 = puVar9[uVar14];
          local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
          local_b8 = (_Base_ptr)0x0;
          p_Stack_b0 = (_Base_ptr)(local_c8 + 8);
          ppuStack_a0 = (_Map_pointer)0x0;
          pRVar8 = (graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar12 = *(pointer *)
                     &pRVar8[uVar2].vector_.
                      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ;
          local_a8 = p_Stack_b0;
          if (pAVar12 ==
              *(pointer *)
               ((long)&pRVar8[uVar2].vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
               + 8)) {
LAB_0011bc66:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"   warning: node ",0x11);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," (t=",4);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,
                                (problemGraph->problem_->nodes).
                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar2].t);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cx=",5);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar2) +
                                        8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cy=",5);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar2) +
                                        0xc));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", frame component=",0x12);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,") has *no* descendant in frame ",0x1f);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
LAB_0011bd71:
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          else {
            do {
              if ((local_118 + 1 ==
                   (long)(pPVar1->nodes).
                         super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                         super__Vector_impl_data._M_start[pAVar12->vertex_].t) &&
                 ((solution->edge_labels).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[pAVar12->edge_] == '\0')) {
                std::
                _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                ::_M_insert_unique<unsigned_long_const&>
                          ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)local_c8,
                           local_e8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + pAVar12->vertex_);
                pRVar8 = (graph->vertices_).
                         super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              }
              pAVar12 = pAVar12 + 1;
            } while (pAVar12 !=
                     *(pointer *)
                      ((long)&pRVar8[uVar2].vector_.
                              super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                      + 8));
            if (ppuStack_a0 == (_Map_pointer)0x0) goto LAB_0011bc66;
            if (ppuStack_a0 != (_Map_pointer)0x1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"   warning: node ",0x11);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," (t=",4);
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar7,
                                  *(int *)((long)((problemGraph->problem_->nodes).
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar2)
                                          + 8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cx=",5);
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar7,
                                  *(int *)((long)((problemGraph->problem_->nodes).
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar2)
                                          + 8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cy=",5);
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar7,
                                  *(int *)((long)((problemGraph->problem_->nodes).
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar2)
                                          + 0xc));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", frame component=",0x12);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,") has ",6);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," descendants in frame ",0x16);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              goto LAB_0011bd71;
            }
          }
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)local_c8);
          uVar14 = uVar14 + 1;
          pvVar10 = (problemGraph->nodeIndicesInFrame_).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar9 = pvVar10[local_118].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar14 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar10[local_118].
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)puVar9 >> 3));
      }
      if (local_118 != 0) {
        pvVar10 = (problemGraph->nodeIndicesInFrame_).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar9 = pvVar10[local_118].
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar10[local_118].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 8) == puVar9) {
LAB_0011c129:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"   labeling of incoming inter-frame edges is moral",0x32
                    );
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
          std::ostream::put(-0x20);
          std::ostream::flush();
          lVar11 = extraout_RDX;
        }
        else {
          bVar6 = true;
          uVar14 = 0;
          do {
            uVar2 = puVar9[uVar14];
            local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
            local_b8 = (_Base_ptr)0x0;
            p_Stack_b0 = (_Base_ptr)(local_c8 + 8);
            ppuStack_a0 = (_Map_pointer)0x0;
            pRVar8 = (graph->vertices_).
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pAVar12 = *(pointer *)
                       &pRVar8[uVar2].vector_.
                        super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
            ;
            local_d0 = uVar14;
            local_a8 = p_Stack_b0;
            if (pAVar12 ==
                *(pointer *)
                 ((long)&pRVar8[uVar2].vector_.
                         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                 + 8)) {
LAB_0011bfc2:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"   warning: node ",0x11);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," (t=",4);
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar7,
                                  (problemGraph->problem_->nodes).
                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar2].t);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cx=",5);
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar7,
                                  *(int *)((long)((problemGraph->problem_->nodes).
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar2)
                                          + 8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cy=",5);
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar7,
                                  *(int *)((long)((problemGraph->problem_->nodes).
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar2)
                                          + 0xc));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", frame component=",0x12);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,") has no ancestor in frame ",0x1b);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
            }
            else {
              do {
                if ((local_118 - 1 ==
                     (long)(pPVar1->nodes).
                           super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl
                           .super__Vector_impl_data._M_start[pAVar12->vertex_].t) &&
                   ((solution->edge_labels).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[pAVar12->edge_] == '\0')) {
                  std::
                  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  ::_M_insert_unique<unsigned_long_const&>
                            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                              *)local_c8,
                             local_e8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + pAVar12->vertex_);
                  if ((_Map_pointer)0x1 < ppuStack_a0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"   error: morality violated at node ",0x24);
                    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (t=",4);
                    poVar7 = (ostream *)
                             std::ostream::operator<<
                                       ((ostream *)poVar7,
                                        (problemGraph->problem_->nodes).
                                        super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar2].t);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cx=",5);
                    poVar7 = (ostream *)
                             std::ostream::operator<<
                                       ((ostream *)poVar7,
                                        *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                                
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar2)
                                                + 8));
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cy=",5);
                    poVar7 = (ostream *)
                             std::ostream::operator<<
                                       ((ostream *)poVar7,
                                        *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                                
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar2)
                                                + 0xc));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,", frame component=",0x12);
                    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                    std::ostream::put((char)poVar7);
                    std::ostream::flush();
                    bVar6 = false;
                  }
                }
                pAVar12 = pAVar12 + 1;
              } while (pAVar12 !=
                       *(pointer *)
                        ((long)&(graph->vertices_).
                                super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar2].vector_.
                                super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                        + 8));
              if (ppuStack_a0 == (_Map_pointer)0x0) goto LAB_0011bfc2;
            }
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)local_c8);
            uVar14 = local_d0 + 1;
            pvVar10 = (problemGraph->nodeIndicesInFrame_).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar9 = pvVar10[local_118].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (uVar14 < (ulong)((long)*(pointer *)
                                           ((long)&pvVar10[local_118].
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                    (long)puVar9 >> 3));
          if (bVar6) goto LAB_0011c129;
        }
        sVar13 = local_118 - 1;
        pvVar10 = (problemGraph->edgeIndicesFromFrame_).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar9 = pvVar10[sVar13].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_48.problem_ = pPVar1;
        local_48.edgeLabels_ = &solution->edge_labels;
        local_48.firstFrame_ = sVar13;
        if (*(pointer *)
             ((long)&pvVar10[sVar13].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 8) != puVar9) {
          local_d0 = CONCAT44(local_d0._4_4_,(int)CONCAT71((int7)((ulong)lVar11 >> 8),1));
          uVar14 = 0;
          do {
            uVar2 = puVar9[uVar14];
            if ((solution->edge_labels).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2] == '\x01') {
              pEVar3 = (problemGraph->graph_).edges_.
                       super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              vs = pEVar3[uVar2].vertexIndices_[0];
              vt = pEVar3[uVar2].vertexIndices_[1];
              local_88 = (_Elt_pointer)0x0;
              ppuStack_80 = (_Map_pointer)0x0;
              local_98 = (_Elt_pointer)0x0;
              puStack_90 = (_Elt_pointer)0x0;
              local_a8 = (_Base_ptr)0x0;
              ppuStack_a0 = (_Map_pointer)0x0;
              local_b8 = (_Base_ptr)0x0;
              p_Stack_b0 = (_Base_ptr)0x0;
              local_c8._0_8_ = (_Map_pointer)0x0;
              local_c8._8_8_ = 0;
              std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                        ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,0);
              bVar6 = andres::graph::
                      spsp<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                (graph,&local_48,vs,vt,
                                 (deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
              if (bVar6) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"   error: the inter-frame edge ",0x1f);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," between nodes ",0xf);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," (t=",4);
                poVar7 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)poVar7,
                                    (problemGraph->problem_->nodes).
                                    super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_start[vs].t);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cx=",5);
                poVar7 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)poVar7,
                                    *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                        
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + vs) +
                                            8));
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cy=",5);
                poVar7 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)poVar7,
                                    *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                        
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + vs) +
                                            0xc));
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", frame component=",0x12)
                ;
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,") and ",6);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," (t=",4);
                poVar7 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)poVar7,
                                    (problemGraph->problem_->nodes).
                                    super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_start[vt].t);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cx=",5);
                poVar7 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)poVar7,
                                    *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                        
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + vt) +
                                            8));
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", cy=",5);
                poVar7 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)poVar7,
                                    *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                        
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + vt) +
                                            0xc));
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", frame component=",0x12)
                ;
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,") is part of a violated inter-frame cycle constraint.",0x35);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                local_d0 = local_d0 & 0xffffffff00000000;
              }
              std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                        ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
              pvVar10 = (problemGraph->edgeIndicesFromFrame_).
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            uVar14 = uVar14 + 1;
            puVar9 = pvVar10[sVar13].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (uVar14 < (ulong)((long)*(pointer *)
                                           ((long)&pvVar10[sVar13].
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                    (long)puVar9 >> 3));
          if ((local_d0 & 1) == 0) goto LAB_0011c4cc;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "   labeling of incoming inter-frame edges satisfies cycle constraints",0x45);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
      }
LAB_0011c4cc:
      local_118 = local_118 + 1;
    } while (local_118 < problemGraph->numberOfFrames_);
  }
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline
void validate(ProblemGraph const& problemGraph, Solution const& solution)
{
    struct SubgraphWithoutCut
    {
        SubgraphWithoutCut(lineage::Solution::EdgeLabels const& edgeLabels) :
            edgeLabels_(edgeLabels)
        {}
        
        bool vertex(size_t i) const
        { 
            return true;
        }
        
        bool edge(size_t i) const
        {
            return edgeLabels_[i] == 0;
        }

        lineage::Solution::EdgeLabels const& edgeLabels_;
    };

    typedef ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<lineage::Solution::EdgeLabels> SubgraphCutPerFrame;
    typedef ProblemGraph::SubgraphOfTwoFramesWithoutCut<lineage::Solution::EdgeLabels> SubgraphCutTwoFrames;
    typedef andres::graph::ComponentsBySearch<ProblemGraph::Graph> ComponentLabeling;

    Problem const& problem = problemGraph.problem();

    ComponentLabeling components;
    SubgraphWithoutCut subgraphCut(solution.edge_labels);
    components.build(problemGraph.graph(), subgraphCut);

    ComponentLabeling componentsPerFrame;
    SubgraphCutPerFrame subgraphCutPerFrame(problem, solution.edge_labels);
    componentsPerFrame.build(problemGraph.graph(), subgraphCutPerFrame);

    // print numbers of nodes and edges
    std::cerr << "overall: " << problem.nodes.size()
        << " nodes, " << problem.edges.size()
        << " edges" << std::endl;

    for (size_t frame = 0; frame < problemGraph.numberOfFrames(); ++frame)
    {
        std::cerr << "frame " << frame
            << ": " << problemGraph.numberOfNodesInFrame(frame)
            << " nodes, " << problemGraph.numberOfEdgesInFrame(frame)
            << " edges" << std::endl;

        if (frame != 0)
            std::cerr << "   " << problemGraph.numberOfEdgesFromFrame(frame-1)
                << " inter-frame edges with frame " << frame - 1
                << std::endl;
        
        if (frame != problemGraph.numberOfFrames() - 1)
            std::cerr << "   " << problemGraph.numberOfEdgesFromFrame(frame)
                << " inter-frame edges with frame " << frame + 1
                << std::endl;

        // test whether edges labeled 1 well-define a multicut
        bool isMulticut = true;
        for (size_t j = 0; j < problemGraph.numberOfEdgesInFrame(frame); ++j)
        {
            auto e = problemGraph.edgeInFrame(frame, j);

            auto v0 = problemGraph.graph().vertexOfEdge(e, 0);
            auto v1 = problemGraph.graph().vertexOfEdge(e, 1);

            if ((solution.edge_labels[e] == 0) != (componentsPerFrame.labels_[v0] == componentsPerFrame.labels_[v1]))
            {
                std::cerr << "   error: the intra-frame edge " << e
                    << " between nodes " << v0
                    << " (t=" << problemGraph.problem().nodes[v0].t
                    << ", cx=" << problemGraph.problem().nodes[v0].cx
                    << ", cy=" << problemGraph.problem().nodes[v0].cy
                    << ", frame component=" << componentsPerFrame.labels_[v0]
                    << ") and " << v1
                    << " (t=" << problemGraph.problem().nodes[v1].t
                    << ", cx=" << problemGraph.problem().nodes[v1].cx
                    << ", cy=" << problemGraph.problem().nodes[v1].cy
                    << ", frame component=" << componentsPerFrame.labels_[v1]
                    << ") is part of a violated cycle constraint."
                    << std::endl;

                isMulticut = false;
            }
        }

        if (isMulticut)
            std::cerr << "   the intra-frame edges labeled 1 well-define a multicut" << std::endl;

        // report splits and nodes without descendants
        if (frame < problemGraph.numberOfFrames() - 1)
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                std::set<size_t> descendantComponents;
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0); it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto e = it->edge();
                    auto v1 = it->vertex();

                    if (problem.nodes[v1].t == frame + 1 && solution.edge_labels[e] == 0)
                        descendantComponents.insert(componentsPerFrame.labels_[v1]);
                }

                if (descendantComponents.size() == 0)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].t
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has *no* descendant in frame " << frame + 1
                        << std::endl;
                else if (descendantComponents.size() > 1)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].cx
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has " << descendantComponents.size()
                        << " descendants in frame " << frame + 1
                        << std::endl;
            }

        // test morality and report nodes without ancestors
        bool isMoral = true;
        if (frame != 0)
        {
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                std::set<size_t> ancestorComponents;
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0); it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto e = it->edge();
                    auto v1 = it->vertex();
                    
                    if (problem.nodes[v1].t == frame - 1 && solution.edge_labels[e] == 0)
                    {
                        ancestorComponents.insert(componentsPerFrame.labels_[v1]);

                        if (ancestorComponents.size() > 1)
                        {
                            isMoral = false;

                            std::cerr << "   error: morality violated at node " << v0
                                << " (t=" << problemGraph.problem().nodes[v0].t
                                << ", cx=" << problemGraph.problem().nodes[v0].cx
                                << ", cy=" << problemGraph.problem().nodes[v0].cy
                                << ", frame component=" << componentsPerFrame.labels_[v0]
                                << ")" << std::endl;
                        }
                    }
                }

                if (ancestorComponents.size() == 0)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].t
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has no ancestor in frame " << frame - 1
                        << std::endl;
            }
            
            if (isMoral)
                std::cerr << "   labeling of incoming inter-frame edges is moral" << std::endl;
        }

        // test cycle constraints of inter-frame edges
        if (frame != 0)
        {
            SubgraphCutTwoFrames subgraph(problem, solution.edge_labels, frame - 1);

            bool cycleConstraintsSatisfied = true;
            for (size_t j = 0; j < problemGraph.numberOfEdgesFromFrame(frame - 1); ++j)
            {
                auto e = problemGraph.edgeFromFrame(frame - 1, j);

                if (solution.edge_labels[e] == 1) // cut
                {
                    auto v0 = problemGraph.graph().vertexOfEdge(e, 0);
                    auto v1 = problemGraph.graph().vertexOfEdge(e, 1);
                    
                    std::deque<std::size_t> path;
                    if (andres::graph::spsp(problemGraph.graph(), subgraph, v0, v1, path) == true)
                    {
                        cycleConstraintsSatisfied = false;

                        std::cerr << "   error: the inter-frame edge " << e
                            << " between nodes " << v0
                            << " (t=" << problemGraph.problem().nodes[v0].t
                            << ", cx=" << problemGraph.problem().nodes[v0].cx
                            << ", cy=" << problemGraph.problem().nodes[v0].cy
                            << ", frame component=" << componentsPerFrame.labels_[v0]
                            << ") and " << v1
                            << " (t=" << problemGraph.problem().nodes[v1].t
                            << ", cx=" << problemGraph.problem().nodes[v1].cx
                            << ", cy=" << problemGraph.problem().nodes[v1].cy
                            << ", frame component=" << componentsPerFrame.labels_[v1]
                            << ") is part of a violated inter-frame cycle constraint."
                            << std::endl;
                    }
                }
            }

            if (cycleConstraintsSatisfied)
                std::cerr << "   labeling of incoming inter-frame edges satisfies cycle constraints" << std::endl;
        }
    }
}